

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

Message * __thiscall helics::MessageHolder::newMessage(MessageHolder *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  value_type index;
  Message *message;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffb8;
  value_type *__x;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  value_type local_28 [2];
  value_type local_14;
  pointer local_10;
  
  local_10 = (pointer)0x0;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffd0);
  if (bVar1) {
    __x = local_28;
    std::make_unique<helics::Message>();
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::push_back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                 *)in_RDI,__x);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_ffffffffffffffd0);
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            *)in_RDI);
    local_10 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::get
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          in_RDI);
    sVar3 = std::
            vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            ::size((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RDI);
    local_10->counter = (int)sVar3 + -1;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::back(in_RDI);
    local_14 = *pvVar2;
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x1df3eb);
    std::make_unique<helics::Message>();
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)in_RDI,(long)local_14);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI,
               in_stack_ffffffffffffffb8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_ffffffffffffffd0);
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  *)in_RDI,(long)local_14);
    local_10 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::get
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          in_RDI);
    local_10->counter = local_14;
  }
  local_10->messageValidation = 0xb3;
  local_10->backReference = in_RDI;
  return local_10;
}

Assistant:

Message* MessageHolder::newMessage()
{
    Message* message{nullptr};
    if (!freeMessageSlots.empty()) {
        auto index = freeMessageSlots.back();
        freeMessageSlots.pop_back();
        messages[index] = std::make_unique<Message>();
        message = messages[index].get();
        message->counter = index;

    } else {
        messages.push_back(std::make_unique<Message>());
        message = messages.back().get();
        message->counter = static_cast<int32_t>(messages.size()) - 1;
    }

    message->messageValidation = messageKeyCode;
    message->backReference = static_cast<void*>(this);
    return message;
}